

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

t_operand __thiscall
xemmai::ast::t_if::f_emit(t_if *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  size_t sVar1;
  pointer ptVar2;
  t_emit *ptVar3;
  t_label *a_label;
  t_operand tVar4;
  t_label *label1;
  size_t stack;
  vector<bool,_std::allocator<bool>_> privates;
  t_label *label0;
  bool a_clear_local;
  bool a_operand_local;
  bool a_tail_local;
  t_emit *a_emit_local;
  t_if *this_local;
  anon_union_8_4_0f1077ea_for_t_operand_2 local_10;
  
  ptVar2 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
           operator->(&this->v_condition);
  (*ptVar2->_vptr_t_node[3])(ptVar2,a_emit,0,0);
  privates.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)t_emit::f_label(a_emit);
  t_emit::f_pop(a_emit);
  ptVar3 = t_emit::operator<<(a_emit,c_instruction__BRANCH);
  ptVar3 = t_emit::operator<<(ptVar3,a_emit->v_stack);
  t_emit::operator<<(ptVar3,(t_label *)
                            privates.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&stack,a_emit->v_privates);
  sVar1 = a_emit->v_stack;
  anon_unknown_11::f_emit_block(a_emit,&this->v_true,a_tail,a_clear,(bool)(this->v_preserve & 1));
  t_emit::f_join(a_emit,&this->v_junction);
  a_label = t_emit::f_label(a_emit);
  ptVar3 = t_emit::operator<<(a_emit,c_instruction__JUMP);
  t_emit::operator<<(ptVar3,a_label);
  t_emit::f_target(a_emit,(t_label *)
                          privates.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage);
  std::vector<bool,_std::allocator<bool>_>::operator=
            (a_emit->v_privates,(vector<bool,_std::allocator<bool>_> *)&stack);
  a_emit->v_stack = sVar1;
  anon_unknown_11::f_emit_block(a_emit,&this->v_false,a_tail,a_clear,(bool)(this->v_preserve & 1));
  t_emit::f_join(a_emit,&this->v_junction);
  t_emit::f_target(a_emit,a_label);
  t_emit::f_merge(a_emit,&this->v_junction);
  t_operand::t_operand((t_operand *)&this_local);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&stack);
  tVar4._4_4_ = 0;
  tVar4.v_tag = (uint)this_local;
  tVar4.field_1.v_integer = local_10.v_integer;
  return tVar4;
}

Assistant:

t_operand t_if::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	v_condition->f_emit(a_emit, false, false);
	auto& label0 = a_emit.f_label();
	a_emit.f_pop();
	a_emit << c_instruction__BRANCH << a_emit.v_stack << label0;
	auto privates = *a_emit.v_privates;
	auto stack = a_emit.v_stack;
	f_emit_block(a_emit, v_true, a_tail, a_clear, v_preserve);
	a_emit.f_join(v_junction);
	auto& label1 = a_emit.f_label();
	a_emit << c_instruction__JUMP << label1;
	a_emit.f_target(label0);
	*a_emit.v_privates = privates;
	a_emit.v_stack = stack;
	f_emit_block(a_emit, v_false, a_tail, a_clear, v_preserve);
	a_emit.f_join(v_junction);
	a_emit.f_target(label1);
	a_emit.f_merge(v_junction);
	return {};
}